

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O2

void weffects(obj *obj,schar dx,schar dy,schar dz)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  xchar x;
  xchar y;
  level *plVar7;
  boolean bVar8;
  ushort uVar9;
  int iVar10;
  trap *ptVar11;
  char *pcVar12;
  engr *peVar13;
  char *pcVar14;
  obj *obj_00;
  char *pcVar15;
  uint uVar16;
  int x_00;
  int iVar17;
  int iVar18;
  obj *in_stack_fffffffffffffe88;
  int yy;
  int xx;
  d_level *local_148;
  trap *local_140;
  char local_138 [264];
  
  sVar2 = obj->otyp;
  bVar1 = objects[sVar2].field_0x10;
  exercise(2,'\x01');
  y = u.uy;
  x = u.ux;
  if ((((u.usteed == (monst *)0x0) || (dz < '\x01')) || (dy != '\0' || dx != '\0')) ||
     ((*(ushort *)&objects[sVar2].field_0x11 & 0xc) == 4)) {
LAB_0027eb16:
    uVar9 = *(ushort *)&objects[sVar2].field_0x11 >> 2 & 3;
    if (uVar9 == 1) {
      zapnodir(obj);
      return;
    }
    if (uVar9 == 2) {
      obj_zapped = '\0';
      if ((u._1052_1_ & 1) == 0) {
        if (dz == '\0') {
          uVar16 = mt_random();
          beam_hit((int)dx,(int)dy,(uVar16 & 7) + 6,0,bhitm,bhito,obj,(boolean *)0x0);
          goto LAB_0027ed07;
        }
        iVar17 = (int)u.ux;
        iVar18 = (int)u.uy;
        yy = iVar18;
        xx = iVar17;
        ptVar11 = t_at(level,iVar17,iVar18);
        sVar3 = obj->otyp;
        if (sVar3 == 0x186) {
LAB_0027ef8e:
          bVar8 = is_db_wall(iVar17,iVar18);
          if ((bVar8 != '\0') && (bVar8 = find_drawbridge(&xx,&yy), bVar8 != '\0')) {
            open_drawbridge(xx,yy);
LAB_0027f093:
            bVar4 = true;
            goto LAB_0027f09b;
          }
          if ('\0' < dz) {
            if ((((x == (level->dnstair).sx) && (y == (level->dnstair).sy)) &&
                (bVar8 = on_level(&u.uz,&dungeon_topology.d_qstart_level), bVar8 != '\0')) &&
               (bVar8 = ok_to_quest(), bVar8 == '\0')) {
              pline("The stairs seem to ripple momentarily.");
              bVar4 = true;
            }
            else {
LAB_0027f018:
              bVar4 = false;
            }
            goto LAB_0027f0a4;
          }
LAB_0027f42d:
          bVar4 = false;
        }
        else {
          if (sVar3 == 0x187) {
LAB_0027ee27:
            bVar6 = true;
            bVar5 = false;
LAB_0027ee2c:
            local_140 = ptVar11;
            if (level->locations[iVar17][iVar18].typ == '$') {
              iVar10 = iVar18;
              x_00 = iVar17;
              if ('\0' < dz) {
LAB_0027ee5e:
                if (bVar5) {
                  close_drawbridge(x_00,iVar10);
                }
                else {
                  destroy_drawbridge(x_00,iVar10);
                }
                goto LAB_0027f093;
              }
            }
            else {
              iVar10 = is_drawbridge_wall(iVar17,iVar18);
              if (((iVar10 != 0) && (bVar8 = is_db_wall(iVar17,iVar18), bVar8 == '\0')) &&
                 (bVar8 = find_drawbridge(&xx,&yy), iVar10 = yy, x_00 = xx, bVar8 != '\0'))
              goto LAB_0027ee5e;
            }
            if ((bVar6 && dz < '\0') && (uVar16 = mt_random(), uVar16 % 3 != 0)) {
              local_148 = &u.uz;
              bVar8 = on_level(&u.uz,&dungeon_topology.d_air_level);
              if ((bVar8 == '\0') &&
                 (((bVar8 = on_level(local_148,&dungeon_topology.d_water_level), bVar8 == '\0' &&
                   ((u._1052_1_ & 2) == 0)) &&
                  (bVar8 = on_level(local_148,&dungeon_topology.d_qstart_level), bVar8 == '\0')))) {
                pcVar12 = ceiling(iVar17,iVar18);
                pcVar14 = body_part(8);
                pline("A rock is dislodged from the %s and falls on your %s.",pcVar12,pcVar14);
                iVar10 = 6;
                if ((uarmh != (obj *)0x0) &&
                   (uVar9 = *(ushort *)&objects[uarmh->otyp].field_0x11 >> 4 & 0x1f, 10 < uVar9)) {
                  iVar10 = (uint)(0x11 < uVar9) * 4 + 2;
                }
                iVar10 = rnd(iVar10);
                losehp(iVar10,"falling rock",0);
                obj_00 = mksobj_at(0x213,level,iVar17,iVar18,'\0','\0');
                if (obj_00 != (obj *)0x0) {
                  xname(obj_00);
                  stackobj(in_stack_fffffffffffffe88);
                }
                newsym(iVar17,iVar18);
                goto LAB_0027f42d;
              }
            }
            bVar4 = false;
            if (((!(bool)(bVar5 & local_140 != (trap *)0x0)) || (dz < '\x01')) ||
               ((local_140->field_0x8 & 0x1f) != 0xe)) goto LAB_0027f09b;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0027ef6e;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0027ef69;
LAB_0027f260:
              if ((local_140->field_0x8 & 0x20) == 0) {
                bVar8 = is_ice(level,iVar17,iVar18);
                pcVar12 = "frost";
                if (bVar8 == '\0') {
                  pcVar12 = "dust";
                }
                bVar4 = false;
                pline("You see a swirl of %s beneath you.",pcVar12);
              }
              else {
                pline("A trap door beneath you closes up then vanishes.");
                bVar4 = true;
              }
            }
            else {
LAB_0027ef69:
              if (ublindf != (obj *)0x0) {
LAB_0027ef6e:
                if (ublindf->oartifact == '\x1d') goto LAB_0027f260;
              }
              bVar4 = false;
              You_hear("a twang followed by a thud.");
            }
            deltrap(level,local_140);
            newsym(iVar17,iVar18);
          }
          else {
            bVar4 = false;
            bVar5 = true;
            bVar6 = false;
            if (sVar3 == 0x18c) goto LAB_0027ee2c;
            if (sVar3 == 0x1a4) {
              bVar8 = on_level(&u.uz,&dungeon_topology.d_air_level);
              if ((((bVar8 != '\0') ||
                   (bVar8 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar8 != '\0')) ||
                  ((u._1052_1_ & 2) != 0)) ||
                 ((bVar8 = on_level(&u.uz,&dungeon_topology.d_qstart_level), dz < '\0' &&
                  (bVar8 != '\0')))) {
                bVar4 = false;
                pline("Nothing happens.");
                goto LAB_0027f09b;
              }
              if (-1 < dz) {
                if (level->objects[u.ux][u.uy] != (obj *)0x0) goto LAB_0027f018;
                peVar13 = engr_at(level,u.ux,u.uy);
                if ((peVar13 == (engr *)0x0) || (peVar13->engr_type != '\x02')) {
                  bVar8 = is_pool(level,(int)u.ux,(int)u.uy);
                  if ((bVar8 == '\0') && (bVar8 = is_ice(level,(int)u.ux,(int)u.uy), bVar8 == '\0'))
                  {
                    bVar8 = is_lava(level,(int)u.ux,(int)u.uy);
                    pcVar12 = "boil";
                    if (bVar8 == '\0') {
                      pcVar12 = "pool";
                    }
                    if (u.uprops[0x12].extrinsic == 0 && u.uprops[0x12].intrinsic == 0) {
                      pcVar14 = "at";
                      if ((youmonst.data)->mlet == '\x05') {
                        pcVar14 = "beneath";
                      }
                    }
                    else {
                      pcVar14 = "beneath";
                    }
                    pcVar15 = body_part(5);
                    pcVar15 = makeplural(pcVar15);
                    pline("Blood %ss %s your %s.",pcVar12,pcVar14,pcVar15);
                  }
                  else {
                    pline("Nothing happens.");
                  }
                }
                bVar4 = false;
                goto LAB_0027f0a4;
              }
              pcVar12 = body_part(2);
              bVar4 = false;
              pline("Blood drips on your %s.",pcVar12);
              goto switchD_0027f116_caseD_1a0;
            }
            if (sVar3 == 0x1c4) goto LAB_0027ee27;
            if (sVar3 == 0x1cc) goto LAB_0027ef8e;
            bVar6 = false;
            if (sVar3 == 0x1cd) goto LAB_0027ee2c;
            if (sVar3 == 0x1ce) {
              if (dz < '\0') {
                pcVar12 = ceiling(iVar17,iVar18);
                pline("You probe towards the %s.",pcVar12);
              }
              else {
                iVar10 = bhitpile(obj,bhito,iVar17,iVar18);
                pcVar12 = surface(iVar17,iVar18);
                pline("You probe beneath the %s.",pcVar12);
                iVar17 = display_binventory(iVar17,iVar18,'\x01');
                bVar4 = true;
                if (iVar17 + iVar10 != 0) goto switchD_0027f116_caseD_1a0;
              }
              pline("Your probe reveals nothing.");
              bVar4 = true;
              goto switchD_0027f116_caseD_1a0;
            }
LAB_0027f09b:
            if (dz < '\x01') goto switchD_0027f116_caseD_1a0;
          }
LAB_0027f0a4:
          bhitpile(obj,bhito,iVar17,iVar18);
          peVar13 = engr_at(level,x,y);
          if ((peVar13 != (engr *)0x0) && (peVar13->engr_type != '\x06')) {
            sVar3 = obj->otyp;
            switch(sVar3) {
            case 0x1c4:
switchD_0027f178_caseD_1c4:
LAB_0027f463:
              plVar7 = level;
              iVar17 = dice(2,4);
              wipe_engr_at(plVar7,x,y,(xchar)iVar17);
              break;
            case 0x1c5:
            case 0x1ca:
switchD_0027f116_caseD_1a1:
              del_engr(level,peVar13);
              break;
            case 0x1c6:
            case 0x1c7:
            case 0x1c8:
              break;
            case 0x1c9:
switchD_0027f116_caseD_19e:
              del_engr(level,peVar13);
              plVar7 = level;
              pcVar12 = random_engraving(local_138);
              make_engr_at(plVar7,iVar17,iVar18,pcVar12,(ulong)moves,'\0');
              break;
            case 0x1cb:
switchD_0027f116_caseD_19f:
              rloc_engr(peVar13);
              break;
            default:
              switch(sVar3) {
              case 0x19e:
                goto switchD_0027f116_caseD_19e;
              case 0x19f:
                goto switchD_0027f116_caseD_19f;
              case 0x1a0:
              case 0x1a2:
              case 0x1a3:
                break;
              case 0x1a1:
                goto switchD_0027f116_caseD_1a1;
              case 0x1a4:
                if (peVar13->engr_type == '\x02') {
                  pcVar12 = "The edges on the floor get smoother.";
                  if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
                    if (u.umonnum == u.umonster) {
                      pcVar12 = "The floor runs like butter!";
                    }
                    else {
                      bVar8 = dmgtype(youmonst.data,0x24);
                      pcVar12 = "The edges on the floor get smoother.";
                      if (bVar8 == '\0') {
                        pcVar12 = "The floor runs like butter!";
                      }
                    }
                  }
                  pline(pcVar12);
                  goto LAB_0027f463;
                }
                break;
              default:
                if (sVar3 == 0x187) goto switchD_0027f178_caseD_1c4;
              }
            }
          }
        }
      }
      else {
        bhitm(u.ustuck,obj);
LAB_0027ed07:
        bVar4 = false;
      }
switchD_0027f116_caseD_1a0:
      if (obj_zapped == '\x01') {
        pline("You feel shuddering vibrations.");
      }
      goto LAB_0027edf1;
    }
    if ((sVar2 == 0x1cf) || (sVar2 == 0x17d)) {
      zap_dig(dx,dy,dz);
    }
    else {
      if ((ushort)(sVar2 - 0x17eU) < 5) {
        iVar17 = sVar2 + -0x174;
        iVar18 = u.ulevel / 2 + 1;
      }
      else {
        iVar17 = sVar2 + -0x1d0;
        if (5 < (ushort)iVar17) {
          warning("weffects: unexpected spell or wand");
          goto LAB_0027edee;
        }
        iVar18 = (uint)(sVar2 != 0x1d0) * 4 + 2;
      }
      buzz(iVar17,iVar18,u.ux,u.uy,(int)dx,(int)dy);
    }
  }
  else {
    uVar16 = (ushort)obj->otyp - 0x185;
    if (0x1c < uVar16) {
LAB_0027eac6:
      uVar16 = (ushort)obj->otyp - 0x1c4;
      if (uVar16 < 0xb) {
        if ((0x16fU >> (uVar16 & 0x1f) & 1) != 0) goto LAB_0027eadb;
        if (uVar16 == 7) goto LAB_0027ed68;
        if (uVar16 != 10) goto LAB_0027eb16;
        probe_monster(u.usteed);
        discover_object(0x1ce,'\x01','\x01');
LAB_0027eae5:
        bVar4 = true;
        goto LAB_0027edf1;
      }
      goto LAB_0027eb16;
    }
    if ((0x12021067U >> (uVar16 & 0x1f) & 1) != 0) {
LAB_0027eadb:
      bhitm(u.usteed,obj);
      goto LAB_0027eae5;
    }
    if (uVar16 != 0x1a) goto LAB_0027eac6;
LAB_0027ed68:
    tele((char *)0x0);
    if (((u.uprops[0xf].extrinsic == 0 && u.uprops[0xf].intrinsic == 0) &&
        (((youmonst.data)->mflags1 & 0x4000000) == 0)) && ((viz_array[u.uy0][u.ux0] & 1U) != 0)) {
      iVar17 = dist2((int)u.ux0,(int)u.uy0,(int)u.ux,(int)u.uy);
      bVar4 = true;
      if (iVar17 < 0x10) goto LAB_0027edf1;
    }
    discover_object((int)obj->otyp,'\x01','\x01');
  }
LAB_0027edee:
  bVar4 = true;
LAB_0027edf1:
  if ((bVar4) && ((bVar1 & 1) == 0)) {
    discover_object((int)sVar2,'\x01','\x01');
    more_experienced(0,0,10);
  }
  return;
}

Assistant:

void weffects(struct obj *obj, schar dx, schar dy, schar dz)
{
	int otyp = obj->otyp;
	boolean disclose = FALSE, was_unkn = !objects[otyp].oc_name_known;

	exercise(A_WIS, TRUE);
	if (u.usteed && (objects[otyp].oc_dir != NODIR) &&
	    !dx && !dy && (dz > 0) && zap_steed(obj)) {
		disclose = TRUE;
	} else if (objects[otyp].oc_dir == IMMEDIATE) {
	    obj_zapped = FALSE;

	    if (u.uswallow) {
		bhitm(u.ustuck, obj);
		/* [how about `bhitpile(u.ustuck->minvent)' effect?] */
	    } else if (dz) {
		disclose = zap_updown(obj, dz);
	    } else {
		beam_hit(dx, dy, rn1(8,6), ZAPPED_WAND, bhitm, bhito, obj, NULL);
	    }
	    /* give a clue if obj_zapped */
	    if (obj_zapped)
		pline("You feel shuddering vibrations.");

	} else if (objects[otyp].oc_dir == NODIR) {
	    zapnodir(obj);

	} else {
	    /* neither immediate nor directionless */

	    if (otyp == WAN_DIGGING || otyp == SPE_DIG)
		zap_dig(dx, dy, dz);
	    else if (otyp >= SPE_MAGIC_MISSILE && otyp <= SPE_FINGER_OF_DEATH)
		buzz(otyp - SPE_MAGIC_MISSILE + 10,
		     u.ulevel / 2 + 1,
		     u.ux, u.uy, dx, dy);
	    else if (otyp >= WAN_MAGIC_MISSILE && otyp <= WAN_LIGHTNING)
		buzz(otyp - WAN_MAGIC_MISSILE,
		     (otyp == WAN_MAGIC_MISSILE) ? 2 : 6,
		     u.ux, u.uy, dx, dy);
	    else
		warning("weffects: unexpected spell or wand");
	    disclose = TRUE;
	}
	if (disclose && was_unkn) {
	    makeknown(otyp);
	    more_experienced(0, 0, 10);
	}
	return;
}